

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O2

double fcss_seas(double *b,int pq,void *params)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  void *__ptr;
  void *__ptr_00;
  ulong uVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  void *pvVar20;
  uint uVar21;
  long lVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  
  uVar17 = *params;
  lVar13 = (long)(int)uVar17;
  iVar5 = *(int *)((long)params + 0xc);
  lVar12 = (long)iVar5;
  uVar18 = *(uint *)((long)params + 0x10);
  uVar1 = *(uint *)((long)params + 0x18);
  uVar21 = uVar18 * iVar5 + uVar17;
  uVar2 = *(uint *)((long)params + 8);
  lVar14 = (long)(int)uVar2;
  lVar22 = (int)(uVar1 * iVar5) + lVar14;
  uVar3 = *(uint *)((long)params + 0x28);
  iVar4 = *(int *)((long)params + 0x50);
  lVar6 = (long)(int)uVar21;
  __ptr = malloc(lVar6 * 8);
  __ptr_00 = malloc(lVar22 * 8);
  uVar7 = 0;
  uVar15 = 0;
  if (0 < (int)uVar17) {
    uVar15 = (ulong)uVar17;
  }
  for (; lVar8 = lVar13, uVar15 != uVar7; uVar7 = uVar7 + 1) {
    *(double *)((long)__ptr + uVar7 * 8) = b[uVar7];
  }
  for (; lVar8 < lVar6; lVar8 = lVar8 + 1) {
    *(undefined8 *)((long)__ptr + lVar8 * 8) = 0;
  }
  uVar10 = 0;
  uVar7 = 0;
  if (0 < (int)uVar2) {
    uVar7 = (ulong)uVar2;
  }
  for (; uVar7 != uVar10; uVar10 = uVar10 + 1) {
    *(double *)((long)__ptr_00 + uVar10 * 8) = b[lVar13 + uVar10];
  }
  for (; lVar14 < lVar22; lVar14 = lVar14 + 1) {
    *(undefined8 *)((long)__ptr_00 + lVar14 * 8) = 0;
  }
  uVar10 = 0;
  uVar19 = 0;
  if (0 < (int)uVar18) {
    uVar19 = (ulong)uVar18;
  }
  pvVar20 = (void *)((long)__ptr + lVar12 * 8);
  while (uVar10 != uVar19) {
    dVar23 = b[(long)(int)(uVar17 + uVar2) + uVar10];
    uVar10 = uVar10 + 1;
    *(double *)((long)__ptr + uVar10 * lVar12 * 8 + -8) =
         *(double *)((long)__ptr + uVar10 * lVar12 * 8 + -8) + dVar23;
    for (uVar11 = 0; uVar15 != uVar11; uVar11 = uVar11 + 1) {
      *(double *)((long)pvVar20 + uVar11 * 8) =
           *(double *)((long)pvVar20 + uVar11 * 8) - b[uVar11] * dVar23;
    }
    pvVar20 = (void *)((long)pvVar20 + lVar12 * 8);
  }
  iVar9 = uVar17 + uVar2 + uVar18;
  uVar15 = 0;
  uVar10 = 0;
  if (0 < (int)uVar1) {
    uVar10 = (ulong)uVar1;
  }
  pvVar20 = (void *)((long)__ptr_00 + lVar12 * 8);
  while (uVar15 != uVar10) {
    dVar23 = b[(long)iVar9 + uVar15];
    uVar15 = uVar15 + 1;
    *(double *)((long)__ptr_00 + uVar15 * lVar12 * 8 + -8) =
         *(double *)((long)__ptr_00 + uVar15 * lVar12 * 8 + -8) + dVar23;
    for (uVar19 = 0; uVar7 != uVar19; uVar19 = uVar19 + 1) {
      *(double *)((long)pvVar20 + uVar19 * 8) =
           b[lVar13 + uVar19] * dVar23 + *(double *)((long)pvVar20 + uVar19 * 8);
    }
    pvVar20 = (void *)((long)pvVar20 + lVar12 * 8);
  }
  iVar16 = iVar4 + uVar3;
  uVar15 = 0;
  uVar7 = (ulong)uVar21;
  if ((int)uVar21 < 1) {
    uVar7 = uVar15;
  }
  for (; uVar7 != uVar15; uVar15 = uVar15 + 1) {
    *(undefined8 *)((long)params + uVar15 * 8 + (long)iVar16 * 8 + 0x58) = 0;
  }
  if (*(int *)((long)params + 0x2c) == 1) {
    uVar15 = 0;
    uVar10 = 0;
    if (0 < (int)uVar3) {
      uVar10 = (ulong)uVar3;
    }
    for (; uVar10 != uVar15; uVar15 = uVar15 + 1) {
      *(double *)((long)params + uVar15 * 8 + (long)iVar4 * 8 + 0x58) =
           *(double *)((long)params + uVar15 * 8 + (long)(int)(iVar4 + uVar3 * 2) * 8 + 0x58) -
           b[(int)(iVar9 + uVar1)];
    }
  }
  iVar5 = uVar17 + uVar18 * iVar5;
  lVar14 = ((ulong)(uint)(iVar4 + iVar5) << 0x20) + -0x100000000;
  lVar12 = ((ulong)(uint)(iVar5 + iVar16) << 0x20) + -0x100000000;
  dVar24 = 0.0;
  uVar17 = 0;
  dVar23 = 0.0;
  while( true ) {
    uVar18 = (uint)lVar22;
    if ((int)uVar17 < (int)(uint)lVar22) {
      uVar18 = uVar17;
    }
    if ((int)uVar18 < 1) {
      uVar18 = 0;
    }
    if ((int)uVar3 <= lVar6) break;
    dVar25 = *(double *)((long)params + (lVar6 + iVar4) * 8 + 0x58);
    lVar13 = lVar14;
    for (uVar15 = 0; uVar7 != uVar15; uVar15 = uVar15 + 1) {
      dVar25 = dVar25 - *(double *)((long)__ptr + uVar15 * 8) *
                        *(double *)((long)params + (lVar13 >> 0x1d) + 0x58);
      lVar13 = lVar13 + -0x100000000;
    }
    lVar13 = lVar12;
    for (uVar15 = 0; uVar18 != uVar15; uVar15 = uVar15 + 1) {
      dVar25 = dVar25 - *(double *)((long)__ptr_00 + uVar15 * 8) *
                        *(double *)((long)params + (lVar13 >> 0x1d) + 0x58);
      lVar13 = lVar13 + -0x100000000;
    }
    dVar24 = dVar24 + 1.0;
    uVar17 = uVar17 + 1;
    *(double *)((long)params + (lVar6 + iVar16) * 8 + 0x58) = dVar25;
    dVar23 = dVar23 + dVar25 * dVar25;
    lVar6 = lVar6 + 1;
    lVar14 = lVar14 + 0x100000000;
    lVar12 = lVar12 + 0x100000000;
  }
  *(double *)((long)params + 0x40) = dVar23;
  dVar23 = log(dVar23 / dVar24);
  *(double *)((long)params + 0x48) = dVar23 * 0.5;
  free(__ptr);
  free(__ptr_00);
  return dVar23 * 0.5;
}

Assistant:

double fcss_seas(double *b, int pq, void *params) {
	double value, ssq,temp;
	int p, q, ps, qs, s, offset,jm;
	int ip, iq, i, j, N,iter,ncond;
	double *phi, *theta;

	value = ssq =  0.0;
	
	alik_css_seas_object obj = (alik_css_seas_object)params;

	ip = obj->p + (obj->s * obj->P);
	iq = obj->q + (obj->s * obj->Q);

	N = obj->N;
	p = obj->p;
	ps = obj->P;
	q = obj->q;
	qs = obj->Q;
	s = obj->s;
	offset = obj->offset;
	ncond = p + s* ps;

	//printf("\n %d %d %d \n", s,ps, qs);

	phi = (double*)malloc(sizeof(double)* ip);
	theta = (double*)malloc(sizeof(double)* iq);



	for (i = 0; i < p; ++i) {
		phi[i] = b[i];
	}

	for (i = p; i < ip; ++i) {
		phi[i] = 0.0;
	}

	for (i = 0; i < q; ++i) {
		theta[i] = b[i + p];
	}

	for (i = q; i < iq; ++i) {
		theta[i] = 0.0;
	}

	for (j = 0; j < ps; ++j) {
		phi[(j + 1)*s - 1] += b[p + q + j];
		for (i = 0; i < p; ++i) {
			phi[(j + 1)*s + i] -= b[i] * b[p + q + j];
		}
	}

	for (j = 0; j < qs; ++j) {
		theta[(j + 1)*s - 1] += b[p + q + ps + j];
		for (i = 0; i < q; ++i) {
			theta[(j + 1)*s + i] += b[i + p] * b[p + q + ps + j];
		}
	}
	//mdisplay(theta, 1, q + s*qs);
	//mdisplay(b, 1, p + q + ps + qs);
	for (i = 0; i < ncond; ++i) {
		obj->x[offset+N + i] = 0.0;
	}

	if (obj->M == 1) {
		for (i = 0; i < N; ++i) {
			obj->x[offset+i] = obj->x[offset+ 2 * N + i] - b[p+q+ps+qs];
		}
	}
	iter = 0;
	for (i = ncond; i < N; ++i) {
		iter++;
		temp = obj->x[offset+i];

		for (j = 0; j < ip; ++j) {
			temp = temp - phi[j] * obj->x[offset + i - j - 1];
		}

		if (i - ncond < iq) {
			jm = i - ncond;
		}
		else {
			jm = iq;
		}

		for (j = 0; j < jm; ++j) {
			temp = temp - theta[j] * obj->x[offset+N + i - j - 1];
		}

		obj->x[offset+N + i] = temp;
		ssq += temp * temp;
	}
	obj->ssq = ssq;
	value = 0.5 * log(ssq / (double)iter);
	obj->loglik = value;

	//printf("ssq %g %g \n", value,ssq);

	free(phi);
	free(theta);
	return value;
}